

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O1

int __thiscall efsw::String::compare(String *this,char *s)

{
  int iVar1;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_30;
  
  String((String *)&local_30,s);
  iVar1 = std::__cxx11::
          basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::compare
                    (&this->mString,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return iVar1;
}

Assistant:

int String::compare( const char* s ) const {
	return compare( String( s ) );
}